

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetConfidentialTxOutByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **asset_string,
              int64_t *value_satoshi,char **value_commitment,char **nonce,char **locking_script,
              char **surjection_proof,char **rangeproof)

{
  bool *pbVar1;
  bool bVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pcVar6;
  char *pcVar7;
  char *pcVar8;
  CfdException *pCVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  Amount AVar14;
  char *work_surjection_proof;
  char *work_locking_script;
  char *work_nonce;
  char *work_value_commitment;
  char *work_asset_string;
  ConfidentialValue value;
  ConfidentialTxOutReference ref;
  bool local_209;
  string local_208;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [16];
  _func_int *local_1a8 [5];
  char *local_180;
  char *local_178;
  undefined8 local_170;
  char **local_168;
  char **local_160;
  ConfidentialValue local_158;
  void *local_130;
  ConfidentialTxOutReference local_128;
  
  local_1c0 = (char *)0x0;
  local_1c8 = (char *)0x0;
  local_1d0 = (char *)0x0;
  local_1d8 = (char *)0x0;
  local_1e0 = (char *)0x0;
  local_170 = 0;
  local_168 = value_commitment;
  local_160 = asset_string;
  cfd::Initialize();
  pbVar1 = &local_128.super_AbstractTxOutReference.value_.ignore_check_;
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_128);
  if (local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  local_209 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_209);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) != (ConfidentialTransaction *)0x0)
  {
    if (local_209 == true) {
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)&local_128);
      __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ConfidentialTransaction::GetTxOut
              (&local_128,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (local_160 == (char **)0x0) {
      local_178 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1b8,&local_128.asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&local_158,(ConfidentialAssetId *)local_1b8);
      local_1c0 = cfd::capi::CreateString((string *)&local_158);
      local_178 = local_1c0;
      if (local_158._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_158.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_158._vptr_ConfidentialValue);
      }
      local_1b8._0_8_ = &PTR__ConfidentialAssetId_00723760;
      if ((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]));
      }
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_158,&local_128.confidential_value_);
    if (value_satoshi != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_158);
      if (!bVar2) {
        AVar14 = cfd::core::ConfidentialValue::GetAmount(&local_158);
        local_1b8._0_8_ = AVar14.amount_;
        local_1b8[8] = AVar14.ignore_check_;
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_1b8);
        *value_satoshi = iVar3;
      }
    }
    if (local_168 == (char **)0x0) {
      local_180 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_1b8,&local_158);
      local_1c8 = cfd::capi::CreateString((string *)local_1b8);
      local_180 = local_1c8;
      if ((_func_int **)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    if (nonce == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialNonce::ConfidentialNonce
                ((ConfidentialNonce *)local_1b8,&local_128.nonce_);
      cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_208,(ConfidentialNonce *)local_1b8);
      pcVar4 = cfd::capi::CreateString(&local_208);
      local_1d0 = pcVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      local_1b8._0_8_ = &PTR__ConfidentialNonce_00723710;
      if ((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_1b8._9_7_,local_1b8[8]));
      }
    }
    if (locking_script == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      cfd::core::Script::Script
                ((Script *)local_1b8,&local_128.super_AbstractTxOutReference.locking_script_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_208,(Script *)local_1b8);
      pcVar5 = cfd::capi::CreateString(&local_208);
      local_1d8 = pcVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      cfd::core::Script::~Script((Script *)local_1b8);
    }
    if (surjection_proof == (char **)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      uVar13 = (long)local_128.surjection_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.surjection_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar13 == 0) {
        pcVar6 = (pointer)0x0;
        sVar10 = 0;
      }
      else {
        if ((long)uVar13 < 0) {
          std::__throw_bad_alloc();
        }
        pcVar6 = (pointer)operator_new(uVar13);
        sVar10 = (long)local_128.surjection_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_128.surjection_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_208.field_2._M_allocated_capacity = (size_type)(pcVar6 + uVar13);
      local_208._M_dataplus._M_p = pcVar6;
      if (local_128.surjection_proof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_128.surjection_proof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_208._M_string_length = (size_type)pcVar6;
        memmove(pcVar6,local_128.surjection_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar10);
      }
      local_208._M_string_length = (size_type)(pcVar6 + sVar10);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1b8,(ByteData *)&local_208);
      pcVar7 = cfd::capi::CreateString((string *)local_1b8);
      local_1e0 = pcVar7;
      if ((_func_int **)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if (local_208._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_208._M_dataplus._M_p);
      }
    }
    if (rangeproof == (char **)0x0) {
      pcVar8 = (char *)0x0;
      pcVar11 = local_178;
      pcVar12 = local_180;
    }
    else {
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      uVar13 = (long)local_128.range_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128.range_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_130 = handle;
      if (uVar13 == 0) {
        pcVar6 = (pointer)0x0;
        sVar10 = 0;
      }
      else {
        if ((long)uVar13 < 0) {
          std::__throw_bad_alloc();
        }
        pcVar6 = (pointer)operator_new(uVar13);
        sVar10 = (long)local_128.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_128.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_208.field_2._M_allocated_capacity = (size_type)(pcVar6 + uVar13);
      local_208._M_dataplus._M_p = pcVar6;
      if (local_128.range_proof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_128.range_proof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_208._M_string_length = (size_type)pcVar6;
        memmove(pcVar6,local_128.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar10);
      }
      local_208._M_string_length = (size_type)(pcVar6 + sVar10);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1b8,(ByteData *)&local_208);
      pcVar8 = cfd::capi::CreateString((string *)local_1b8);
      pcVar11 = local_178;
      pcVar12 = local_180;
      if ((_func_int **)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if (local_208._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_208._M_dataplus._M_p);
      }
    }
    if (pcVar11 != (char *)0x0) {
      *local_160 = pcVar11;
    }
    if (pcVar12 != (char *)0x0) {
      *local_168 = pcVar12;
    }
    if (pcVar4 != (char *)0x0) {
      *nonce = pcVar4;
    }
    if (pcVar5 != (char *)0x0) {
      *locking_script = pcVar5;
    }
    if (pcVar7 != (char *)0x0) {
      *surjection_proof = pcVar7;
    }
    if (pcVar8 != (char *)0x0) {
      *rangeproof = pcVar8;
    }
    local_158._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
    return 0;
  }
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)&local_128);
  __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** asset_string,
    int64_t* value_satoshi, char** value_commitment, char** nonce,
    char** locking_script, char** surjection_proof, char** rangeproof) {
  char* work_asset_string = nullptr;
  char* work_value_commitment = nullptr;
  char* work_nonce = nullptr;
  char* work_locking_script = nullptr;
  char* work_surjection_proof = nullptr;
  char* work_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxOutReference ref = tx->GetTxOut(index);

    if (asset_string != nullptr) {
      work_asset_string = CreateString(ref.GetAsset().GetHex());
    }
    ConfidentialValue value = ref.GetConfidentialValue();
    if ((value_satoshi != nullptr) && (!value.HasBlinding())) {
      *value_satoshi = value.GetAmount().GetSatoshiValue();
    }
    if (value_commitment != nullptr) {
      work_value_commitment = CreateString(value.GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(ref.GetNonce().GetHex());
    }
    if (locking_script != nullptr) {
      work_locking_script = CreateString(ref.GetLockingScript().GetHex());
    }
    if (surjection_proof != nullptr) {
      work_surjection_proof = CreateString(ref.GetSurjectionProof().GetHex());
    }
    if (rangeproof != nullptr) {
      work_rangeproof = CreateString(ref.GetRangeProof().GetHex());
    }

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    if (work_value_commitment != nullptr)
      *value_commitment = work_value_commitment;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_surjection_proof != nullptr)
      *surjection_proof = work_surjection_proof;
    if (work_rangeproof != nullptr) *rangeproof = work_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}